

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O0

string * __thiscall
topk_algorithms::ThresholdAlgorithmInstance::ranks_str_abi_cxx11_
          (string *__return_storage_ptr__,ThresholdAlgorithmInstance *this)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  Rank *this_00;
  reference puVar5;
  unsigned_long *r;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  stringstream local_1f0 [7];
  bool first;
  stringstream ss;
  ostream local_1e0 [384];
  unsigned_long *local_60;
  unsigned_long *local_58;
  RankSize local_50 [3];
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  ThresholdAlgorithmInstance *this_local;
  
  ranks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_34 = 0;
  while( true ) {
    uVar3 = (ulong)local_34;
    sVar4 = rank::RankList::size(&this->_rms_list);
    if (sVar4 <= uVar3) break;
    this_00 = rank::RankList::rank(&this->_rms_list,(long)local_34);
    local_50[0] = rank::Rank::size(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,local_50);
    local_34 = local_34 + 1;
  }
  local_58 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_60 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,topk_algorithms::ThresholdAlgorithmInstance::ranks_str[abi:cxx11]()const::__0>
            (local_58,local_60);
  std::__cxx11::stringstream::stringstream(local_1f0);
  bVar1 = true;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  r = (unsigned_long *)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&r);
    if (!bVar2) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    if (!bVar1) {
      std::operator<<(local_1e0,",");
    }
    std::ostream::operator<<(local_1e0,*puVar5);
    bVar1 = false;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ThresholdAlgorithmInstance::ranks_str() const {
        std::vector<Count> ranks;
        for (auto i=0;i<_rms_list.size();++i) { ranks.push_back(_rms_list.rank(i)->size()); }
        std::sort(ranks.begin(), ranks.end(), [](Count a, Count b) { return a > b; });
        std::stringstream ss;
        bool first = true;
        for (auto &r: ranks) {
            if (!first)
                ss << ",";
            ss << r;
            first = false;
        }
        return ss.str();
    }